

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausschebyshev1.hpp
# Opt level: O2

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussChebyshev1<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  size_t idx;
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  weight_container weights;
  point_container points;
  allocator_type local_79;
  double local_78;
  _Vector_base<double,_std::allocator<double>_> local_70;
  double local_58;
  _Vector_base<double,_std::allocator<double>_> local_50;
  double local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_50,npts,(allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_70,npts,&local_79);
  auVar6._8_4_ = (int)(npts >> 0x20);
  auVar6._0_8_ = npts;
  auVar6._12_4_ = 0x45300000;
  local_78 = 3.141592653589793 /
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)npts) - 4503599627370496.0));
  local_58 = local_78 * 0.5;
  uVar3 = npts >> 1;
  sVar2 = npts;
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    auVar7._8_4_ = (int)(sVar2 >> 0x20);
    auVar7._0_8_ = sVar2;
    auVar7._12_4_ = 0x45300000;
    dVar4 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    dVar4 = cos((dVar4 + dVar4 + -1.0) * local_58);
    dVar5 = 1.0 - dVar4 * dVar4;
    if (dVar5 < 0.0) {
      local_38 = dVar4;
      dVar5 = sqrt(dVar5);
      dVar4 = local_38;
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_50._M_impl.super__Vector_impl_data._M_start[uVar1] = dVar4;
    local_70._M_impl.super__Vector_impl_data._M_start[uVar1] = dVar5 * local_78;
    local_50._M_impl.super__Vector_impl_data._M_start[sVar2 - 1] = -dVar4;
    local_70._M_impl.super__Vector_impl_data._M_start[sVar2 - 1] = dVar5 * local_78;
    sVar2 = sVar2 - 1;
  }
  if ((npts & 1) != 0) {
    local_50._M_impl.super__Vector_impl_data._M_start[uVar3] = 0.0;
    local_70._M_impl.super__Vector_impl_data._M_start[uVar3] = local_78;
  }
  std::
  _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_50,
             (vector<double,_std::allocator<double>_> *)&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(size_t npts) {
    point_container points(npts);
    weight_container weights(npts);

    const weight_type pi_ov_npts = M_PI / npts;
    const weight_type pi_ov_2npts = pi_ov_npts / 2;

    // Generate the first half explicitly and reflect
    for(size_t idx = 0; idx < npts/2; ++idx) {
      // Transform index here for two reasons: the mathematical
      // equations are for 1 <= i <= n, and the nodes are generated in
      // decreasing order. This generates them in the right order
      size_t i = npts - idx;

      // The standard nodes and weights are given by
      const auto ti = (2.0 * i - 1.0) * pi_ov_2npts;
      const auto xi = std::cos(ti);
      auto wi = pi_ov_npts;

      // However, as we're integrating f(x) not \frac{f(x)}{\sqrt{1 -
      // x^2}}, we must factor the \sqrt{1-x^2} into the weight
      wi *= std::sqrt(1.0 - xi * xi);

      // Store into memory
      points[idx]  = xi;
      weights[idx] = wi;

      // Reflect to second half
      points[i-1]  = -xi;
      weights[i-1] = wi; 
    }

    // Edge case for odd points
    if(npts % 2) {
      points[npts/2]  = 0.0;
      weights[npts/2] = pi_ov_npts;
    }


    return std::make_tuple(points, weights);
  }